

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demodulation.hpp
# Opt level: O3

IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
* Inferences::ALASCA::Demodulation::Rhs::iter
            (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
             *__return_storage_ptr__,AlascaState *shared,Clause *cl)

{
  int *piVar1;
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
  IStack_68;
  Clause *local_28;
  undefined8 local_20;
  uint local_18;
  
  local_18 = *(uint *)&cl->field_0x38 & 0xfffff;
  local_20 = 0;
  local_28 = cl;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>>
  ::
  flatMap<Inferences::ALASCA::Demodulation::Rhs::iter(Kernel::AlascaState&,Kernel::Clause*)::_lambda(Kernel::Literal*)_1_>
            (&IStack_68,&local_28,(anon_class_8_1_3fcf6527_for__func)cl);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:80:18),_Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/Demodulation.hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>_>_>
  ::timeTraced(__return_storage_ptr__,&IStack_68,"alasca demodulation rhs");
  if ((IStack_68._iter._current.
       super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>
       ._isSome == true) &&
     (IStack_68._iter._current.
      super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>
      ._elem._elem.init._iter._inner._core != (IteratorCore<Kernel::Term_*> *)0x0)) {
    piVar1 = (int *)((long)IStack_68._iter._current.
                           super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>
                           ._elem._elem.init._iter._inner._core + 8);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)IStack_68._iter._current.
                            super_OptionBase<Lib::IterTraits<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_Demodulation_hpp:84:18),_Inferences::ALASCA::Demodulation::Rhs>_>_>
                            ._elem._elem.init._iter._inner._core + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static auto iter(AlascaState& shared, Clause* cl)
    {
      // TIME_TRACE("alasca demodulation rhs")
      return iterTraits(cl->iterLits())
        .flatMap([cl](Literal* lit) {

          return iterTraits(vi(new NonVariableNonTypeIterator(lit)))
            // TODO filter our things that can never be rewritten
            .map([=](auto t) { return Rhs { .term = TypedTermList(t), .ordOptimization = !(lit->isEquality() && lit->isPositive()), .clause = cl, }; })
            ;
        })
      .timeTraced("alasca demodulation rhs");

    }